

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_5x52_impl.h
# Opt level: O0

int secp256k1_fe_set_b32(secp256k1_fe *r,uchar *a)

{
  int ret;
  uchar *a_local;
  secp256k1_fe *r_local;
  
  r->n[0] = (ulong)CONCAT15(a[0x1a],CONCAT14(a[0x1b],CONCAT13(a[0x1c],CONCAT12(a[0x1d],CONCAT11(a[
                                                  0x1e],a[0x1f]))))) |
            (long)(int)(a[0x19] & 0xf) << 0x30;
  r->n[1] = (long)((int)(uint)a[0x19] >> 4) | (ulong)a[0x18] << 4 | (ulong)a[0x17] << 0xc |
            (ulong)a[0x16] << 0x14 | (ulong)a[0x15] << 0x1c | (ulong)a[0x14] << 0x24 |
            (ulong)a[0x13] << 0x2c;
  r->n[2] = (ulong)CONCAT15(a[0xd],CONCAT14(a[0xe],CONCAT13(a[0xf],CONCAT12(a[0x10],CONCAT11(a[0x11]
                                                  ,a[0x12]))))) | (long)(int)(a[0xc] & 0xf) << 0x30;
  r->n[3] = (long)((int)(uint)a[0xc] >> 4) | (ulong)a[0xb] << 4 | (ulong)a[10] << 0xc |
            (ulong)a[9] << 0x14 | (ulong)a[8] << 0x1c | (ulong)a[7] << 0x24 | (ulong)a[6] << 0x2c;
  r->n[4] = (ulong)CONCAT15(*a,CONCAT14(a[1],CONCAT13(a[2],CONCAT12(a[3],CONCAT11(a[4],a[5])))));
  return (uint)((((r->n[4] == 0xffffffffffff && (r->n[3] & r->n[2] & r->n[1]) == 0xfffffffffffff) &&
                 0xffffefffffc2e < r->n[0]) ^ 0xffU) & 1);
}

Assistant:

static int secp256k1_fe_set_b32(secp256k1_fe *r, const unsigned char *a) {
    int ret;
    r->n[0] = (uint64_t)a[31]
            | ((uint64_t)a[30] << 8)
            | ((uint64_t)a[29] << 16)
            | ((uint64_t)a[28] << 24)
            | ((uint64_t)a[27] << 32)
            | ((uint64_t)a[26] << 40)
            | ((uint64_t)(a[25] & 0xF)  << 48);
    r->n[1] = (uint64_t)((a[25] >> 4) & 0xF)
            | ((uint64_t)a[24] << 4)
            | ((uint64_t)a[23] << 12)
            | ((uint64_t)a[22] << 20)
            | ((uint64_t)a[21] << 28)
            | ((uint64_t)a[20] << 36)
            | ((uint64_t)a[19] << 44);
    r->n[2] = (uint64_t)a[18]
            | ((uint64_t)a[17] << 8)
            | ((uint64_t)a[16] << 16)
            | ((uint64_t)a[15] << 24)
            | ((uint64_t)a[14] << 32)
            | ((uint64_t)a[13] << 40)
            | ((uint64_t)(a[12] & 0xF) << 48);
    r->n[3] = (uint64_t)((a[12] >> 4) & 0xF)
            | ((uint64_t)a[11] << 4)
            | ((uint64_t)a[10] << 12)
            | ((uint64_t)a[9]  << 20)
            | ((uint64_t)a[8]  << 28)
            | ((uint64_t)a[7]  << 36)
            | ((uint64_t)a[6]  << 44);
    r->n[4] = (uint64_t)a[5]
            | ((uint64_t)a[4] << 8)
            | ((uint64_t)a[3] << 16)
            | ((uint64_t)a[2] << 24)
            | ((uint64_t)a[1] << 32)
            | ((uint64_t)a[0] << 40);
    ret = !((r->n[4] == 0x0FFFFFFFFFFFFULL) & ((r->n[3] & r->n[2] & r->n[1]) == 0xFFFFFFFFFFFFFULL) & (r->n[0] >= 0xFFFFEFFFFFC2FULL));
#ifdef VERIFY
    r->magnitude = 1;
    if (ret) {
        r->normalized = 1;
        secp256k1_fe_verify(r);
    } else {
        r->normalized = 0;
    }
#endif
    return ret;
}